

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeInternalForces
          (ChElementHexaANCF_3813_9 *this,ChVectorDynamic<> *Fi)

{
  ChMatrixNM<double,_11,_3> *d;
  long lVar1;
  double *pdVar2;
  byte bVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  long lVar6;
  ActualDstType actualDst;
  ulong uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  Brick9_Force formula;
  ChVectorN<double,_33> result;
  ChIntegrable3D<Eigen::Matrix<double,_33,_1,_0,_33,_1>_> local_410;
  Transpose<Eigen::Matrix<double,_11,_3,_1,_11,_3>_> local_408;
  Scalar local_400;
  undefined1 local_3f8 [88];
  long alStack_3a0 [5];
  undefined1 local_378 [64];
  undefined1 local_338 [64];
  double local_2f8;
  long alStack_2f0 [88];
  
  d = &this->m_d;
  CalcCoordMatrix(this,d);
  CalcCoordDerivMatrix(this,&this->m_d_dt);
  lVar6 = 0;
  local_410._vptr_ChIntegrable3D = (_func_int **)d;
  local_408.m_matrix = d;
  memset((Matrix<double,_11,_11,_0,_11,_11> *)local_3f8,0,0x3c8);
  local_400 = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,11,3,1,11,3>,Eigen::Transpose<Eigen::Matrix<double,11,3,1,11,3>>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,11,11,0,11,11>>
            ((Matrix<double,_11,_11,_0,_11,_11> *)local_3f8,d,&local_408,&local_400);
  auVar5 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  auVar21._8_8_ = 0xb;
  auVar21._0_8_ = 0xb;
  auVar21._16_8_ = 0xb;
  auVar21._24_8_ = 0xb;
  auVar22._8_8_ = 0x58;
  auVar22._0_8_ = 0x58;
  auVar22._16_8_ = 0x58;
  auVar22._24_8_ = 0x58;
  auVar23._8_8_ = 4;
  auVar23._0_8_ = 4;
  auVar23._16_8_ = 4;
  auVar23._24_8_ = 4;
  auVar8 = vpbroadcastq_avx512vl();
  do {
    uVar7 = vpcmpuq_avx512vl(auVar5,auVar21,1);
    uVar7 = uVar7 & 0xf;
    auVar9 = vpmullq_avx512vl(auVar5,auVar22);
    auVar5 = vpaddq_avx2(auVar5,auVar23);
    lVar1 = lVar6 * 8;
    bVar3 = (byte)uVar7;
    auVar10._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * *(long *)(local_3f8 + lVar1 + 8);
    auVar10._0_8_ = (ulong)(bVar3 & 1) * *(long *)(local_3f8 + lVar1);
    auVar10._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * *(long *)(local_3f8 + lVar1 + 0x10);
    auVar10._24_8_ = (uVar7 >> 3) * *(long *)(local_3f8 + lVar1 + 0x18);
    auVar4 = vpaddq_avx2(auVar8,auVar9);
    vscatterqpd_avx512vl(ZEXT832(&this->m_ddT) + ZEXT832(0) + auVar9,uVar7,auVar10);
    auVar9._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * alStack_3a0[lVar6 + 1];
    auVar9._0_8_ = (ulong)(bVar3 & 1) * alStack_3a0[lVar6];
    auVar9._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * *(long *)(local_378 + lVar6 * 8 + -0x18);
    auVar9._24_8_ = (uVar7 >> 3) * *(long *)(local_378 + lVar6 * 8 + -0x10);
    vscatterqpd_avx512vl(ZEXT832(8) + auVar4,uVar7,auVar9);
    lVar1 = lVar6 * 8;
    auVar11._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * *(long *)(local_338 + lVar1 + -8);
    auVar11._0_8_ = (ulong)(bVar3 & 1) * *(long *)(local_338 + lVar1 + -0x10);
    auVar11._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * *(long *)(local_338 + lVar1);
    auVar11._24_8_ = (uVar7 >> 3) * *(long *)(local_338 + lVar1 + 8);
    vscatterqpd_avx512vl(ZEXT832(0x10) + auVar4,uVar7,auVar11);
    auVar12._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * alStack_2f0[lVar6 + 1];
    auVar12._0_8_ = (ulong)(bVar3 & 1) * alStack_2f0[lVar6];
    auVar12._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * alStack_2f0[lVar6 + 2];
    auVar12._24_8_ = (uVar7 >> 3) * alStack_2f0[lVar6 + 3];
    vscatterqpd_avx512vl(ZEXT832(0x18) + auVar4,uVar7,auVar12);
    auVar13._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * alStack_2f0[lVar6 + 0xc];
    auVar13._0_8_ = (ulong)(bVar3 & 1) * alStack_2f0[lVar6 + 0xb];
    auVar13._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * alStack_2f0[lVar6 + 0xd];
    auVar13._24_8_ = (uVar7 >> 3) * alStack_2f0[lVar6 + 0xe];
    vscatterqpd_avx512vl(ZEXT832(0x20) + auVar4,uVar7,auVar13);
    auVar14._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * alStack_2f0[lVar6 + 0x17];
    auVar14._0_8_ = (ulong)(bVar3 & 1) * alStack_2f0[lVar6 + 0x16];
    auVar14._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * alStack_2f0[lVar6 + 0x18];
    auVar14._24_8_ = (uVar7 >> 3) * alStack_2f0[lVar6 + 0x19];
    vscatterqpd_avx512vl(ZEXT832(0x28) + auVar4,uVar7,auVar14);
    auVar15._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * alStack_2f0[lVar6 + 0x22];
    auVar15._0_8_ = (ulong)(bVar3 & 1) * alStack_2f0[lVar6 + 0x21];
    auVar15._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * alStack_2f0[lVar6 + 0x23];
    auVar15._24_8_ = (uVar7 >> 3) * alStack_2f0[lVar6 + 0x24];
    vscatterqpd_avx512vl(ZEXT832(0x30) + auVar4,uVar7,auVar15);
    auVar16._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * alStack_2f0[lVar6 + 0x2d];
    auVar16._0_8_ = (ulong)(bVar3 & 1) * alStack_2f0[lVar6 + 0x2c];
    auVar16._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * alStack_2f0[lVar6 + 0x2e];
    auVar16._24_8_ = (uVar7 >> 3) * alStack_2f0[lVar6 + 0x2f];
    vscatterqpd_avx512vl(ZEXT832(0x38) + auVar4,uVar7,auVar16);
    auVar17._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * alStack_2f0[lVar6 + 0x38];
    auVar17._0_8_ = (ulong)(bVar3 & 1) * alStack_2f0[lVar6 + 0x37];
    auVar17._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * alStack_2f0[lVar6 + 0x39];
    auVar17._24_8_ = (uVar7 >> 3) * alStack_2f0[lVar6 + 0x3a];
    vscatterqpd_avx512vl(ZEXT832(0x40) + auVar4,uVar7,auVar17);
    auVar18._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * alStack_2f0[lVar6 + 0x43];
    auVar18._0_8_ = (ulong)(bVar3 & 1) * alStack_2f0[lVar6 + 0x42];
    auVar18._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * alStack_2f0[lVar6 + 0x44];
    auVar18._24_8_ = (uVar7 >> 3) * alStack_2f0[lVar6 + 0x45];
    vscatterqpd_avx512vl(ZEXT832(0x48) + auVar4,uVar7,auVar18);
    auVar19._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * alStack_2f0[lVar6 + 0x4e];
    auVar19._0_8_ = (ulong)(bVar3 & 1) * alStack_2f0[lVar6 + 0x4d];
    auVar19._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * alStack_2f0[lVar6 + 0x4f];
    auVar19._24_8_ = (uVar7 >> 3) * alStack_2f0[lVar6 + 0x50];
    lVar6 = lVar6 + 4;
    vscatterqpd_avx512vl(ZEXT832(0x50) + auVar4,uVar7,auVar19);
  } while (lVar6 != 0xc);
  lVar6 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (-1 < lVar6) {
    if (lVar6 != 0) {
      memset((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0
             ,lVar6 << 3);
    }
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    this->m_InteCounter = 0;
    local_338 = vmovdqu64_avx512f(auVar20);
    local_378 = vmovdqu64_avx512f(auVar20);
    unique0x00006d80 = vmovdqu64_avx512f(auVar20);
    local_3f8._0_64_ = vmovdqu64_avx512f(auVar20);
    local_2f8 = 0.0;
    local_410._vptr_ChIntegrable3D = (_func_int **)&PTR__ChIntegrable3D_00b35f08;
    local_408.m_matrix = (non_const_type)this;
    ChQuadrature::Integrate3D<Eigen::Matrix<double,33,1,0,33,1>>
              ((Matrix<double,_33,_1,_0,_33,_1> *)local_3f8,&local_410,-1.0,1.0,-1.0,1.0,-1.0,1.0,2)
    ;
    if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
        0x21) {
      pdVar2 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar7 = 0xfffffffffffffff8;
      do {
        auVar20 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar2 + uVar7 + 8),
                                 *(undefined1 (*) [64])(alStack_3a0 + (uVar7 - 3)));
        *(undefined1 (*) [64])(pdVar2 + uVar7 + 8) = auVar20;
        uVar7 = uVar7 + 8;
      } while (uVar7 < 0x18);
      pdVar2[0x20] = pdVar2[0x20] - local_2f8;
      return;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, 33, 1>, Functor = Eigen::internal::sub_assign_op<double, double>]"
                 );
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    CalcCoordMatrix(m_d);
    CalcCoordDerivMatrix(m_d_dt);
    m_ddT = m_d * m_d.transpose();

    Fi.setZero();
    // Set plastic counter to zero. This runs for each integration point
    m_InteCounter = 0;
    Brick9_Force formula(this);
    ChVectorN<double, 33> result;
    result.setZero();
    ChQuadrature::Integrate3D<ChVectorN<double, 33>>(result,   // result of integration
                                                     formula,  // integrand formula
                                                     -1, 1,    // x limits
                                                     -1, 1,    // y limits
                                                     -1, 1,    // z limits
                                                     2         // order of integration
    );
    Fi -= result;
}